

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O1

RealType __thiscall OpenMD::NPA::calcConservedQuantity(NPA *this)

{
  Thermo *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  uint i;
  long lVar5;
  Mat3x3d *pMVar6;
  double *pdVar7;
  uint j;
  long lVar8;
  Mat3x3d *pMVar9;
  uint k;
  long lVar10;
  double tmp_1;
  RealType RVar11;
  double dVar12;
  RealType RVar13;
  SquareMatrix3<double> result_1;
  SquareMatrix<double,_3> tmp;
  SquareMatrix3<double> result;
  double local_e8 [27];
  
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])();
  (this->super_NPT).NkBT =
       (double)((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_)->
               nGlobalIntegrableObjects_ * 8.31451e-07 * (this->super_NPT).targetTemp;
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar11 = Thermo::getTotalEnergy(this_00);
  pdVar4 = local_e8 + 0x12;
  local_e8[0x18] = 0.0;
  local_e8[0x19] = 0.0;
  local_e8[0x16] = 0.0;
  local_e8[0x17] = 0.0;
  local_e8[0x14] = 0.0;
  local_e8[0x15] = 0.0;
  local_e8[0x12] = 0.0;
  local_e8[0x13] = 0.0;
  local_e8[0x1a] = 0.0;
  lVar5 = 0;
  pMVar6 = &this->eta;
  do {
    lVar8 = 0;
    pdVar7 = pdVar4;
    do {
      *pdVar7 = (pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                [lVar8];
      lVar8 = lVar8 + 1;
      pdVar7 = pdVar7 + 3;
    } while (lVar8 != 3);
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + 1;
    pMVar6 = (Mat3x3d *)
             ((pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  } while (lVar5 != 3);
  local_e8[6] = 0.0;
  local_e8[7] = 0.0;
  local_e8[4] = 0.0;
  local_e8[5] = 0.0;
  local_e8[2] = 0.0;
  local_e8[3] = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_e8[8] = 0.0;
  pdVar4 = local_e8 + 0x12;
  lVar5 = 0;
  do {
    lVar8 = 0;
    pMVar6 = &this->eta;
    do {
      dVar12 = local_e8[lVar5 * 3 + lVar8];
      lVar10 = 0;
      pMVar9 = pMVar6;
      do {
        dVar12 = dVar12 + pdVar4[lVar10] *
                          (pMVar9->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                          data_[0][0];
        lVar10 = lVar10 + 1;
        pMVar9 = (Mat3x3d *)
                 ((pMVar9->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                 );
      } while (lVar10 != 3);
      local_e8[lVar5 * 3 + lVar8] = dVar12;
      lVar8 = lVar8 + 1;
      pMVar6 = (Mat3x3d *)
               ((pMVar6->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0] +
               1);
    } while (lVar8 != 3);
    lVar5 = lVar5 + 1;
    pdVar4 = pdVar4 + 3;
  } while (lVar5 != 3);
  lVar5 = 0;
  do {
    *(undefined8 *)((long)local_e8 + lVar5 + 0x58) = *(undefined8 *)((long)local_e8 + lVar5 + 0x10);
    *(undefined8 *)((long)local_e8 + lVar5 + 0x48) = *(undefined8 *)((long)local_e8 + lVar5);
    *(undefined8 *)((long)local_e8 + lVar5 + 0x50) = *(undefined8 *)((long)local_e8 + lVar5 + 8);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x48);
  dVar12 = 0.0;
  lVar5 = 0;
  do {
    dVar12 = dVar12 + *(double *)((long)local_e8 + lVar5 + 0x48);
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x60);
  dVar1 = (this->super_NPT).NkBT;
  dVar2 = (this->super_NPT).targetPressure;
  dVar3 = (this->super_NPT).tb2;
  RVar13 = Thermo::getVolume(this_00);
  return ((RVar13 * dVar2) / 163882576.0) / 0.0004184 +
         RVar11 + (dVar12 * dVar1 * dVar3) / 0.0008368;
}

Assistant:

RealType NPA::calcConservedQuantity() {
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + barostat_kinetic + barostat_potential;

    return conservedQuantity;
  }